

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O0

int __thiscall kj::Directory::symlink(Directory *this,char *__from,char *__to)

{
  bool bVar1;
  uint uVar2;
  uint extraout_EAX;
  uint extraout_EAX_00;
  undefined8 in_RCX;
  undefined8 in_R8;
  WriteMode in_R9D;
  Fault local_78;
  Fault f_1;
  Fault local_60;
  Fault f;
  WriteMode mode_local;
  Directory *this_local;
  StringPtr content_local;
  PathPtr linkpath_local;
  
  content_local.content.size_ = (size_t)__from;
  uVar2 = (*(this->super_ReadableDirectory).super_FsNode._vptr_FsNode[0x13])
                    (this,__from,__to,in_RCX,in_R8,(ulong)in_R9D);
  if ((uVar2 & 1) == 0) {
    bVar1 = has<kj::WriteMode,void>(in_R9D,CREATE);
    if (bVar1) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[20],kj::PathPtr&>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x275,FAILED,(char *)0x0,"\"path already exists\", linkpath",
                 (char (*) [20])"path already exists",(PathPtr *)&content_local.content.size_);
      kj::_::Debug::Fault::~Fault(&local_60);
      uVar2 = extraout_EAX;
    }
    else {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49],kj::PathPtr&>
                (&local_78,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x278,FAILED,(char *)0x0,
                 "\"symlink() returned null despite no preconditions\", linkpath",
                 (char (*) [49])"symlink() returned null despite no preconditions",
                 (PathPtr *)&content_local.content.size_);
      kj::_::Debug::Fault::~Fault(&local_78);
      uVar2 = extraout_EAX_00;
    }
  }
  return uVar2;
}

Assistant:

void Directory::symlink(PathPtr linkpath, StringPtr content, WriteMode mode) const {
  if (!trySymlink(linkpath, content, mode)) {
    if (has(mode, WriteMode::CREATE)) {
      KJ_FAIL_REQUIRE("path already exists", linkpath) { break; }
    } else {
      // Shouldn't happen.
      KJ_FAIL_ASSERT("symlink() returned null despite no preconditions", linkpath) { break; }
    }
  }
}